

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

AggregateFunction * __thiscall
duckdb::GetTypedReservoirQuantileListAggregateFunction<float,float>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  LogicalType result_type;
  allocator_type local_59;
  LogicalType local_58 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28 [24];
  
  duckdb::LogicalType::LIST(local_28);
  duckdb::LogicalType::LogicalType(local_58,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = local_58;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_40,local_28,
             AggregateFunction::StateSize<duckdb::ReservoirQuantileState<float>>,
             AggregateFunction::
             StateInitialize<duckdb::ReservoirQuantileState<float>,duckdb::ReservoirQuantileListOperation<float>,(duckdb::AggregateDestructorType)0>
             ,AggregateFunction::
              UnaryScatterUpdate<duckdb::ReservoirQuantileState<float>,float,duckdb::ReservoirQuantileListOperation<float>>
             ,AggregateFunction::
              StateCombine<duckdb::ReservoirQuantileState<float>,duckdb::ReservoirQuantileListOperation<float>>
             ,AggregateFunction::
              StateFinalize<duckdb::ReservoirQuantileState<float>,duckdb::list_entry_t,duckdb::ReservoirQuantileListOperation<float>>
             ,AggregateFunction::
              UnaryUpdate<duckdb::ReservoirQuantileState<float>,float,duckdb::ReservoirQuantileListOperation<float>>
             ,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::ReservoirQuantileState<float>,duckdb::ReservoirQuantileListOperation<float>>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  duckdb::LogicalType::~LogicalType(local_58);
  duckdb::LogicalType::~LogicalType(local_28);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetTypedReservoirQuantileListAggregateFunction(const LogicalType &type) {
	using STATE = ReservoirQuantileState<SAVE_TYPE>;
	using OP = ReservoirQuantileListOperation<INPUT_TYPE>;
	auto fun = ReservoirQuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(type, type);
	return fun;
}